

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayQueryFunction::checkArguments
          (ArrayQueryFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  Compilation *this_00;
  reference ppEVar4;
  size_type sVar5;
  Type *pTVar6;
  SourceLocation in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  SourceLocation in_RSI;
  Expression *in_RDI;
  SourceLocation in_R8;
  int32_t *in_stack_00000018;
  Args *in_stack_00000020;
  ASTContext *in_stack_00000028;
  Type *indexType;
  int32_t knownIndex;
  Type *type;
  Compilation *comp;
  Type *pTVar7;
  Diagnostic *this_01;
  Type *in_stack_ffffffffffffff38;
  ASTContext *in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  DiagCode code;
  ASTContext *in_stack_ffffffffffffff68;
  SystemSubroutine *in_stack_ffffffffffffff70;
  Args *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 isMethod;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SystemSubroutine *in_stack_ffffffffffffffa8;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x999b21);
  pTVar7 = (Type *)0x1;
  this_01 = (Diagnostic *)0x2;
  callRange.endLoc = in_R8;
  callRange.startLoc = in_RCX;
  bVar1 = ast::SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffffa8,
                     (ASTContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (bool)isMethod,in_stack_ffffffffffffff90,callRange,(size_t)in_RDX,
                     (size_t)in_RSI);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x999bc1);
    bVar1 = Type::isIntegral((Type *)this_01);
    if ((((!bVar1) && (bVar1 = Type::isUnpackedArray(pTVar7), !bVar1)) &&
        (bVar1 = Type::isString((Type *)0x999bf8), !bVar1)) ||
       (bVar1 = Type::isScalar((Type *)0x999c0b), bVar1)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      local_8 = ast::SystemSubroutine::badArg
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
    }
    else {
      bVar1 = Type::hasFixedRange((Type *)this_01);
      if ((bVar1) ||
         (ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                    operator[](in_RDX,0), (*ppEVar4)->kind != DataType)) {
        bVar1 = false;
        sVar5 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0x999d15);
        if (sVar5 < 2) {
          bVar1 = true;
        }
        else {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,1);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x999d3d);
          bVar2 = Type::isIntegral((Type *)this_01);
          if (!bVar2) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,1);
            pTVar7 = ast::SystemSubroutine::badArg
                               (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
            return pTVar7;
          }
          bVar2 = ASTContext::inUnevaluatedBranch((ASTContext *)this_01);
          if ((!bVar2) &&
             (bVar2 = checkDim(in_stack_00000028,in_stack_00000020,in_stack_00000018), !bVar2)) {
            pTVar7 = Compilation::getErrorType(this_00);
            return pTVar7;
          }
        }
        code = SUB84((ulong)in_RDI >> 0x20,0);
        bVar2 = Type::isAssociativeArray((Type *)0x999de7);
        if (bVar2) {
          pTVar6 = Type::getAssociativeIndexType(pTVar7);
          if ((bVar1) &&
             ((pTVar6 == (Type *)0x0 || (bVar2 = Type::isIntegral((Type *)this_01), !bVar2)))) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,0);
            sourceRange_00.endLoc = in_stack_ffffffffffffff58;
            sourceRange_00.startLoc = in_stack_ffffffffffffff50;
            ASTContext::addDiag(in_stack_ffffffffffffff48,code,sourceRange_00);
            Diagnostic::operator<<(this_01,(string *)pTVar7);
            pTVar7 = Compilation::getErrorType(this_00);
            return pTVar7;
          }
          if (bVar1) {
            return pTVar6;
          }
          bVar3 = Type::getBitWidth(in_stack_ffffffffffffff38);
          if (0x20 < bVar3) {
            return pTVar6;
          }
        }
        local_8 = Compilation::getIntegerType(this_00);
      }
      else {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        sourceRange.endLoc = in_stack_ffffffffffffff58;
        sourceRange.startLoc = in_RSI;
        ASTContext::addDiag(in_stack_ffffffffffffff48,SUB84((ulong)in_RDI >> 0x20,0),sourceRange);
        Diagnostic::operator<<(this_01,(string *)pTVar7);
        local_8 = Compilation::getErrorType(this_00);
      }
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 2))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if ((!type.isIntegral() && !type.isUnpackedArray() && !type.isString()) || type.isScalar())
            return badArg(context, *args[0]);

        // Spec says we have to disallow this case.
        if (!type.hasFixedRange() && args[0]->kind == ExpressionKind::DataType) {
            context.addDiag(diag::QueryOnDynamicType, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        int32_t knownIndex = 0;
        if (args.size() > 1) {
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);

            // Try to verify the dimension index if it's a constant.
            if (!context.inUnevaluatedBranch() && !checkDim(context, args, knownIndex))
                return comp.getErrorType();
        }
        else {
            // Index defaults to 1 if not provided.
            knownIndex = 1;
        }

        if (type.isAssociativeArray()) {
            // If the first argument is an associative array and we know we're selecting it,
            // ensure that the index type is integral.
            auto indexType = type.getAssociativeIndexType();
            if (knownIndex && (!indexType || !indexType->isIntegral())) {
                context.addDiag(diag::QueryOnAssociativeWildcard, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }

            // If the index is known, the result type is the index type.
            if (knownIndex)
                return *indexType;

            // If the index is unknown, we don't know if they will select the associative array
            // or some other dimension. Use the index type if it's larger than a normal integer,
            // and otherwise just use an integer result type.
            if (indexType->getBitWidth() > 32)
                return *indexType;
        }

        return comp.getIntegerType();
    }